

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

PyObject * libxml_xmlFreeParserCtxt(PyObject *self,PyObject *args)

{
  long lVar1;
  undefined8 *puVar2;
  long *plVar3;
  int iVar4;
  undefined *in_RAX;
  PyObject *pPVar5;
  PyObject *pyobj_ctxt;
  undefined *local_18;
  
  pPVar5 = (PyObject *)0x0;
  local_18 = in_RAX;
  iVar4 = _PyArg_ParseTuple_SizeT(args,"O:xmlFreeParserCtxt",&local_18);
  if (iVar4 != 0) {
    if ((local_18 != &_Py_NoneStruct) && (lVar1 = *(long *)(local_18 + 0x10), lVar1 != 0)) {
      puVar2 = *(undefined8 **)(lVar1 + 0x1a8);
      if (puVar2 != (undefined8 *)0x0) {
        plVar3 = (long *)*puVar2;
        if ((plVar3 != (long *)0x0) && (*plVar3 = *plVar3 + -1, *plVar3 == 0)) {
          _Py_Dealloc();
        }
        plVar3 = (long *)puVar2[1];
        if ((plVar3 != (long *)0x0) && (*plVar3 = *plVar3 + -1, *plVar3 == 0)) {
          _Py_Dealloc();
        }
        (*_xmlFree)(puVar2);
      }
      xmlFreeParserCtxt(lVar1);
    }
    pPVar5 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  return pPVar5;
}

Assistant:

static PyObject *
libxml_xmlFreeParserCtxt(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) {
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlParserCtxtPyCtxtPtr pyCtxt;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlFreeParserCtxt", &pyobj_ctxt))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    if (ctxt != NULL) {
	pyCtxt = (xmlParserCtxtPyCtxtPtr)((xmlParserCtxtPtr)ctxt)->_private;
	if (pyCtxt) {
	    Py_XDECREF(pyCtxt->f);
	    Py_XDECREF(pyCtxt->arg);
	    xmlFree(pyCtxt);
	}
	xmlFreeParserCtxt(ctxt);
    }

    Py_INCREF(Py_None);
    return(Py_None);
}